

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

PropertyString * __thiscall
Js::ScriptContext::GetPropertyString(ScriptContext *this,PropertyRecord *propertyRecord)

{
  PropertyId propertyId;
  PropertyString *pPVar1;
  PropertyRecord *propertyRecord_local;
  ScriptContext *this_local;
  
  propertyId = PropertyRecord::GetPropertyId(propertyRecord);
  pPVar1 = GetProperty<Js::PropertyString>(this,propertyId,propertyRecord);
  return pPVar1;
}

Assistant:

PropertyString* ScriptContext::GetPropertyString(const PropertyRecord* propertyRecord)
    {
        return this->GetProperty<PropertyString>(propertyRecord->GetPropertyId(), propertyRecord);
    }